

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void zng_fill_window(deflate_state *s)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  deflate_state *in_RDI;
  bool bVar4;
  uint init;
  uint curr;
  uint count;
  uint str;
  uint wsize;
  uint more;
  uint n;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  
  uVar2 = in_RDI->w_size;
  do {
    if (uVar2 + (in_RDI->w_size - 0x106) <= in_RDI->strstart) {
      memcpy(in_RDI->window,in_RDI->window + uVar2,(ulong)uVar2);
      if (in_RDI->match_start < uVar2) {
        in_RDI->match_start = 0;
        in_RDI->prev_length = 0;
      }
      else {
        in_RDI->match_start = in_RDI->match_start - uVar2;
      }
      in_RDI->strstart = in_RDI->strstart - uVar2;
      in_RDI->block_start = in_RDI->block_start - uVar2;
      if (in_RDI->strstart < in_RDI->insert) {
        in_RDI->insert = in_RDI->strstart;
      }
      (*functable.slide_hash)(in_RDI);
    }
    if (in_RDI->strm->avail_in == 0) break;
    uVar3 = zng_read_buf((zng_stream *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                         (uchar *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
    in_RDI->lookahead = uVar3 + in_RDI->lookahead;
    if (2 < in_RDI->lookahead + in_RDI->insert) {
      in_stack_ffffffffffffffe8 = in_RDI->strstart - in_RDI->insert;
      if (in_RDI->max_chain_length < 0x401) {
        if (in_stack_ffffffffffffffe8 != 0) {
          (*in_RDI->quick_insert_string)(in_RDI,in_stack_ffffffffffffffe8 - 1);
        }
      }
      else {
        uVar1 = (*in_RDI->update_hash)
                          ((uint)in_RDI->window[in_stack_ffffffffffffffe8],
                           (uint)in_RDI->window[in_stack_ffffffffffffffe8 + 1]);
        in_RDI->ins_h = uVar1;
      }
      in_stack_ffffffffffffffe4 = in_RDI->insert;
      if (in_RDI->lookahead == 1) {
        in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 - 1;
      }
      if (in_stack_ffffffffffffffe4 != 0) {
        (*in_RDI->insert_string)(in_RDI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
        in_RDI->insert = in_RDI->insert - in_stack_ffffffffffffffe4;
      }
    }
    bVar4 = false;
    if (in_RDI->lookahead < 0x106) {
      bVar4 = in_RDI->strm->avail_in != 0;
    }
  } while (bVar4);
  if (in_RDI->high_water < in_RDI->window_size) {
    uVar2 = in_RDI->strstart + in_RDI->lookahead;
    if (in_RDI->high_water < uVar2) {
      uVar3 = in_RDI->window_size - uVar2;
      if (0x102 < uVar3) {
        uVar3 = 0x102;
      }
      memset(in_RDI->window + uVar2,0,(ulong)uVar3);
      in_RDI->high_water = uVar2 + uVar3;
    }
    else if (in_RDI->high_water < uVar2 + 0x102) {
      uVar2 = (uVar2 + 0x102) - in_RDI->high_water;
      if (in_RDI->window_size - in_RDI->high_water < uVar2) {
        uVar2 = in_RDI->window_size - in_RDI->high_water;
      }
      memset(in_RDI->window + in_RDI->high_water,0,(ulong)uVar2);
      in_RDI->high_water = uVar2 + in_RDI->high_water;
    }
  }
  return;
}

Assistant:

void Z_INTERNAL PREFIX(fill_window)(deflate_state *s) {
    unsigned n;
    unsigned int more;    /* Amount of free space at the end of the window. */
    unsigned int wsize = s->w_size;

    Assert(s->lookahead < MIN_LOOKAHEAD, "already enough lookahead");

    do {
        more = s->window_size - s->lookahead - s->strstart;

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {
            memcpy(s->window, s->window+wsize, (unsigned)wsize);
            if (s->match_start >= wsize) {
                s->match_start -= wsize;
            } else {
                s->match_start = 0;
                s->prev_length = 0;
            }
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (int)wsize;
            if (s->insert > s->strstart)
                s->insert = s->strstart;
            FUNCTABLE_CALL(slide_hash)(s);
            more += wsize;
        }
        if (s->strm->avail_in == 0)
            break;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = PREFIX(read_buf)(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead + s->insert >= STD_MIN_MATCH) {
            unsigned int str = s->strstart - s->insert;
            if (UNLIKELY(s->max_chain_length > 1024)) {
                s->ins_h = s->update_hash(s->window[str], s->window[str+1]);
            } else if (str >= 1) {
                s->quick_insert_string(s, str + 2 - STD_MIN_MATCH);
            }
            unsigned int count = s->insert;
            if (UNLIKELY(s->lookahead == 1)) {
                count -= 1;
            }
            if (count > 0) {
                s->insert_string(s, str, count);
                s->insert -= count;
            }
        }
        /* If the whole input has less than STD_MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */
    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to STD_MAX_MATCH since the longest match
     * routines allow scanning to strstart + STD_MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        unsigned int curr = s->strstart + s->lookahead;
        unsigned int init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            memset(s->window + curr, 0, init);
            s->high_water = curr + init;
        } else if (s->high_water < curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            memset(s->window + s->high_water, 0, init);
            s->high_water += init;
        }
    }

    Assert((unsigned long)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "not enough room for search");
}